

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::sendTo
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,
          string_view destination)

{
  atomic<int> *paVar1;
  size_t sVar2;
  string_view string3;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar6;
  FederateState *this_00;
  long lVar7;
  HelicsException *this_01;
  InvalidIdentifier *this_02;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  size_t __n;
  long lVar11;
  void *pvVar12;
  string_view message_00;
  string_view message_01;
  string_view string2;
  byte *st1;
  ActionMessage message;
  undefined1 local_e8 [26];
  uint16_t local_ce;
  Time local_c8;
  SmallBuffer local_a8;
  
  pcVar9 = destination._M_str;
  __n = destination._M_len;
  if (__n == 0) {
    send(this,sourceHandle.hid,data,length,(int)destination._M_len);
    return;
  }
  ppVar6 = getHandleInfo(this,sourceHandle);
  if (ppVar6 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    this_02 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar9 = "handle is not valid";
    sVar10 = 0x13;
LAB_002a2151:
    message_01._M_str = pcVar9;
    message_01._M_len = sVar10;
    InvalidIdentifier::InvalidIdentifier(this_02,message_01);
    __cxa_throw(this_02,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (*(char *)((long)&(ppVar6->first)._M_string_length + 4) != 'e') {
    this_02 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar9 = "handle does not point to an endpoint";
    sVar10 = 0x24;
    goto LAB_002a2151;
  }
  this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar6->first)._M_string_length);
  if (((ppVar6->first)._M_string_length & 0x400000000000000) == 0) goto LAB_002a2005;
  FederateState::getMessageDestinations
            ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)local_e8,this_00,sourceHandle);
  pvVar3 = (void *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
  pvVar4 = (void *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  lVar7 = (long)pvVar4 - (long)pvVar3;
  lVar11 = (lVar7 >> 3) * -0x5555555555555555 >> 2;
  pvVar12 = pvVar3;
  if (0 < lVar11) {
    pvVar8 = (void *)(lVar11 * 0x60 + (long)pvVar3);
    lVar11 = lVar11 + 1;
    pvVar12 = (void *)((long)pvVar3 + 0x30);
    do {
      if (*(size_t *)((long)pvVar12 + -0x28) == __n) {
        iVar5 = bcmp(*(void **)((long)pvVar12 + -0x20),pcVar9,__n);
        if (iVar5 == 0) {
          pvVar12 = (void *)((long)pvVar12 + -0x30);
          goto LAB_002a1fe5;
        }
        sVar2 = *(size_t *)((long)pvVar12 + -0x10);
      }
      else {
        sVar2 = *(size_t *)((long)pvVar12 + -0x10);
      }
      if ((sVar2 == __n) && (iVar5 = bcmp(*(void **)((long)pvVar12 + -8),pcVar9,__n), iVar5 == 0)) {
        pvVar12 = (void *)((long)pvVar12 + -0x18);
        goto LAB_002a1fe5;
      }
      if (*(size_t *)((long)pvVar12 + 8) == __n) {
        iVar5 = bcmp(*(void **)((long)pvVar12 + 0x10),pcVar9,__n);
        if (iVar5 == 0) goto LAB_002a1fe5;
        sVar2 = *(size_t *)((long)pvVar12 + 0x20);
      }
      else {
        sVar2 = *(size_t *)((long)pvVar12 + 0x20);
      }
      if ((sVar2 == __n) && (iVar5 = bcmp(*(void **)((long)pvVar12 + 0x28),pcVar9,__n), iVar5 == 0))
      {
        pvVar12 = (void *)((long)pvVar12 + 0x18);
        goto LAB_002a1fe5;
      }
      lVar11 = lVar11 + -1;
      pvVar12 = (void *)((long)pvVar12 + 0x60);
    } while (1 < lVar11);
    lVar7 = (long)pvVar4 - (long)pvVar8;
    pvVar12 = pvVar8;
  }
  lVar7 = (lVar7 >> 3) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_002a1f96:
    if ((*(size_t *)((long)pvVar12 + 8) != __n) ||
       (iVar5 = bcmp(*(void **)((long)pvVar12 + 0x10),pcVar9,__n), iVar5 != 0)) goto LAB_002a20d8;
  }
  else if (lVar7 == 2) {
LAB_002a1f48:
    if ((*(size_t *)((long)pvVar12 + 8) != __n) ||
       (iVar5 = bcmp(*(void **)((long)pvVar12 + 0x10),pcVar9,__n), iVar5 != 0)) {
      pvVar12 = (void *)((long)pvVar12 + 0x18);
      goto LAB_002a1f96;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_002a20d8;
    if ((*(size_t *)((long)pvVar12 + 8) != __n) ||
       (iVar5 = bcmp(*(void **)((long)pvVar12 + 0x10),pcVar9,__n), iVar5 != 0)) {
      pvVar12 = (void *)((long)pvVar12 + 0x18);
      goto LAB_002a1f48;
    }
  }
LAB_002a1fe5:
  if (pvVar12 != pvVar4) {
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_e8._16_8_ - (long)pvVar3);
    }
LAB_002a2005:
    ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_send_message);
    LOCK();
    paVar1 = &this->messageCounter;
    local_e8._4_4_ = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_e8._4_4_ = local_e8._4_4_ + 1;
    local_e8._8_4_ = *(undefined4 *)&(ppVar6->first)._M_dataplus._M_p;
    local_ce = *(uint16_t *)((long)&(ppVar6->first)._M_string_length + 6);
    local_e8._12_4_ = sourceHandle.hid;
    SmallBuffer::reserve(&local_a8,length);
    local_a8.bufferSize = length;
    memcpy(local_a8.heap,data,length);
    pcVar9 = (char *)(ppVar6->first).field_2._M_allocated_capacity;
    sVar10 = *(size_t *)((long)&(ppVar6->first).field_2 + 8);
    string3._M_str = pcVar9;
    string3._M_len = sVar10;
    string2._M_str = pcVar9;
    string2._M_len = sVar10;
    ActionMessage::setStringData((ActionMessage *)local_e8,destination,string2,string3);
    local_c8.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    return;
  }
LAB_002a20d8:
  this_01 = (HelicsException *)__cxa_allocate_exception(0x28);
  message_00._M_str = "targeted endpoint destination not in target list";
  message_00._M_len = 0x30;
  HelicsException::HelicsException(this_01,message_00);
  *(undefined ***)this_01 = &PTR__HelicsException_004baa80;
  __cxa_throw(this_01,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::sendTo(InterfaceHandle sourceHandle,
                        const void* data,
                        uint64_t length,
                        std::string_view destination)
{
    if (destination.empty()) {
        // sendTo should be the equivalent of send if there is an empty destination
        send(sourceHandle, data, length);
        return;
    }
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }

    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    if (checkActionFlag(*hndl, targeted_flag)) {
        auto targets = fed->getMessageDestinations(sourceHandle);
        auto res = std::find_if(targets.begin(), targets.end(), [destination](const auto& val) {
            return (val.second == destination);
        });
        if (res == targets.end()) {
            throw(InvalidParameter("targeted endpoint destination not in target list"));
        }
    }
    ActionMessage message(CMD_SEND_MESSAGE);

    message.messageID = ++messageCounter;
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.flags = hndl->flags;
    message.payload.assign(data, length);
    message.setStringData(destination, hndl->key, hndl->key);
    message.actionTime = fed->nextAllowedSendTime();
    addActionMessage(std::move(message));
}